

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::yml::preprocess_rxmap(csubstr s,substr buf)

{
  code *pcVar1;
  csubstr s_00;
  csubstr s_01;
  bool bVar2;
  byte bVar3;
  size_t sVar4;
  undefined7 uVar6;
  char *pcVar5;
  byte bVar7;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  int iVar12;
  csubstr s_02;
  csubstr s_03;
  basic_substring<const_char> bVar13;
  _SubstrWriter writer;
  char *local_98;
  basic_substring<const_char> local_88;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  _SubstrWriter local_60;
  uint local_44;
  undefined8 local_40;
  char *local_38;
  
  local_60.buf.len = buf.len;
  pcVar8 = buf.str;
  pcVar9 = (char *)s.len;
  pcVar10 = s.str;
  local_60.pos = 0;
  local_60.buf.str = pcVar8;
  if ((pcVar9 != (char *)0x0) && (*pcVar10 == '{')) {
    if ((pcVar9 == (char *)0x0) || ((pcVar10 + -1)[(long)pcVar9] != '}')) {
      if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        sVar4 = (*pcVar1)();
        return sVar4;
      }
      local_88.str._0_4_ = 0;
      local_88.str._4_4_ = 0;
      local_88.len._0_4_ = 0x8160;
      local_88.len._4_4_ = 0;
      local_78 = 0;
      pcStack_70 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_68 = 0x65;
      (*(code *)PTR_error_impl_00242518)
                ("check failed: s.ends_with(\'}\')",0x1e,(anonymous_namespace)::s_default_callbacks)
      ;
    }
    basic_substring<const_char>::basic_substring(&local_88,pcVar10 + 1,(size_t)(pcVar9 + -2));
    pcVar10 = (char *)CONCAT44(local_88.str._4_4_,local_88.str._0_4_);
    pcVar9 = (char *)CONCAT44(local_88.len._4_4_,(undefined4)local_88.len);
    pcVar8 = extraout_RDX;
  }
  if (local_60.pos < local_60.buf.len) {
    local_60.buf.str[local_60.pos] = '{';
  }
  local_60.pos = local_60.pos + 1;
  local_40 = 0;
  if (pcVar9 == (char *)0x0) {
    local_98 = (char *)0x0;
  }
  else {
    iVar12 = 0;
    local_98 = (char *)0x0;
    pcVar11 = (char *)0x0;
    local_38 = pcVar9;
    do {
      pcVar5 = pcVar11 + 1;
      if (pcVar5 < pcVar9) {
        pcVar8 = (char *)CONCAT71((int7)((ulong)pcVar8 >> 8),pcVar10[(long)pcVar5] == ' ');
      }
      else {
        pcVar8 = (char *)0x0;
      }
      bVar7 = pcVar10[(long)pcVar11];
      if ((bVar7 == 0x27) || (bVar7 == 0x22)) {
        local_44 = (uint)pcVar8;
        if (pcVar9 < pcVar11) {
          if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
            pcVar1 = (code *)swi(3);
            sVar4 = (*pcVar1)();
            return sVar4;
          }
          handle_error(0x1ff947,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       ,0x1533,"first >= 0 && first <= len");
        }
        basic_substring<const_char>::basic_substring
                  (&local_88,pcVar11 + (long)pcVar10,(long)pcVar9 - (long)pcVar11);
        bVar13 = basic_substring<const_char>::pair_range_esc(&local_88,bVar7,'\\');
        pcVar11 = bVar13.str + (bVar13.len - (long)pcVar10);
        pcVar5 = (char *)(ulong)(iVar12 + 1);
        if (1 < iVar12) {
          pcVar5 = (char *)0x0;
        }
        iVar12 = (int)pcVar5;
        pcVar8 = (char *)(ulong)local_44;
        pcVar9 = local_38;
      }
      else if (iVar12 == 0) {
        pcVar5 = (char *)(ulong)(bVar7 - 0x30);
        iVar12 = 1;
        if ((((9 < (byte)(bVar7 - 0x30)) &&
             (pcVar5 = (char *)0x0, 0x19 < (byte)((bVar7 & 0xdf) + 0xbf))) &&
            ((pcVar5 = (char *)(ulong)(bVar7 - 0x24), 0x3b < bVar7 - 0x24 ||
             ((0x800000000000201U >> ((ulong)pcVar5 & 0x3f) & 1) == 0)))) && (bVar7 != 0x7e)) {
          iVar12 = 0;
        }
      }
      uVar6 = (undefined7)((ulong)pcVar5 >> 8);
      bVar3 = (byte)pcVar8;
      if (iVar12 == 2) {
        if (((bVar7 == 0x28) || (bVar7 == 0x7b)) || (bVar7 == 0x5b)) {
          if (pcVar9 < pcVar11) {
            if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
              pcVar1 = (code *)swi(3);
              sVar4 = (*pcVar1)();
              return sVar4;
            }
            handle_error(0x1ff947,
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         ,0x1533,"first >= 0 && first <= len");
          }
          basic_substring<const_char>::basic_substring
                    (&local_88,pcVar10 + (long)pcVar11,(long)pcVar9 - (long)pcVar11);
          bVar13 = basic_substring<const_char>::pair_range_nested(&local_88,bVar7,'\\');
          pcVar5 = bVar13.str;
          pcVar8 = pcVar5 + bVar13.len;
          pcVar11 = pcVar8 + ((long)pcVar11 - (long)(pcVar10 + (long)pcVar11));
          iVar12 = 0;
        }
        else {
          pcVar5 = (char *)CONCAT71(uVar6,bVar7 != 0x2c);
          bVar7 = ~bVar3 | bVar7 != 0x2c;
          pcVar8 = (char *)CONCAT71((int7)((ulong)pcVar8 >> 8),bVar7);
          iVar12 = (bVar7 & 1) * 2;
        }
      }
      else if (iVar12 == 1) {
        pcVar5 = (char *)CONCAT71(uVar6,bVar7 == 0x3a);
        iVar12 = 2;
        if ((bVar7 == 0x3a & bVar3) == 0) {
          bVar3 = bVar7 == 0x2c & bVar3;
          pcVar5 = (char *)CONCAT71(uVar6,bVar3);
          iVar12 = 1;
          if (bVar3 == 1) {
            if (pcVar9 < local_98) {
              if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                pcVar1 = (code *)swi(3);
                sVar4 = (*pcVar1)();
                return sVar4;
              }
              handle_error(0x1ff947,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1544,"first >= 0 && first <= len");
            }
            pcVar8 = pcVar11;
            if (pcVar11 == (char *)0xffffffffffffffff) {
              pcVar8 = pcVar9;
            }
            if (pcVar8 < local_98) {
              if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                pcVar1 = (code *)swi(3);
                sVar4 = (*pcVar1)();
                return sVar4;
              }
              handle_error(0x1ff947,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1546,"first <= last");
            }
            if (pcVar9 < pcVar8) {
              if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
                pcVar1 = (code *)swi(3);
                sVar4 = (*pcVar1)();
                return sVar4;
              }
              handle_error(0x1ff947,
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           ,0x1547,"last >= 0 && last <= len");
            }
            basic_substring<const_char>::basic_substring
                      (&local_88,local_98 + (long)pcVar10,(long)pcVar8 - (long)local_98);
            s_00.str._4_4_ = local_88.str._4_4_;
            s_00.str._0_4_ = local_88.str._0_4_;
            s_00.len._0_4_ = (undefined4)local_88.len;
            s_00.len._4_4_ = local_88.len._4_4_;
            detail::_SubstrWriter::append(&local_60,s_00);
            s_02.len = 5;
            s_02.str = ": 1, ";
            detail::_SubstrWriter::append(&local_60,s_02);
            pcVar5 = pcVar11 + 2;
            pcVar8 = extraout_RDX_00;
            local_98 = pcVar5;
          }
        }
      }
      pcVar11 = pcVar11 + 1;
    } while (pcVar11 < pcVar9);
    local_40 = CONCAT71((int7)((ulong)pcVar5 >> 8),iVar12 == 1);
  }
  if (local_98 <= pcVar9) {
    basic_substring<const_char>::basic_substring
              (&local_88,pcVar10 + (long)local_98,(long)pcVar9 - (long)local_98);
    s_01.str._4_4_ = local_88.str._4_4_;
    s_01.str._0_4_ = local_88.str._0_4_;
    s_01.len._0_4_ = (undefined4)local_88.len;
    s_01.len._4_4_ = local_88.len._4_4_;
    detail::_SubstrWriter::append(&local_60,s_01);
    if ((char)local_40 != '\0') {
      s_03.len = 3;
      s_03.str = ": 1";
      detail::_SubstrWriter::append(&local_60,s_03);
    }
    if (local_60.pos < local_60.buf.len) {
      local_60.buf.str[local_60.pos] = '}';
    }
    return local_60.pos + 1;
  }
  if (((s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
    pcVar1 = (code *)swi(3);
    sVar4 = (*pcVar1)();
    return sVar4;
  }
  handle_error(0x1ff947,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1533,"first >= 0 && first <= len");
}

Assistant:

size_t preprocess_rxmap(csubstr s, substr buf)
{
    detail::_SubstrWriter writer(buf);
    _ppstate state = kReadPending;
    size_t last = 0;

    if(s.begins_with('{'))
    {
        RYML_CHECK(s.ends_with('}'));
        s = s.offs(1, 1);
    }

    writer.append('{');

    for(size_t i = 0; i < s.len; ++i)
    {
        const char curr = s[i];
        const char next = i+1 < s.len ? s[i+1] : '\0';

        if(curr == '\'' || curr == '"')
        {
            csubstr ss = s.sub(i).pair_range_esc(curr, '\\');
            i += static_cast<size_t>(ss.end() - (s.str + i));
            state = _next(state);
        }
        else if(state == kReadPending && _is_idchar(curr))
        {
            state = _next(state);
        }

        switch(state)
        {
        case kKeyPending:
        {
            if(curr == ':' && next == ' ')
            {
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                writer.append(s.range(last, i));
                writer.append(": 1, ");
                last = i + 2;
            }
            break;
        }
        case kValPending:
        {
            if(curr == '[' || curr == '{' || curr == '(')
            {
                csubstr ss = s.sub(i).pair_range_nested(curr, '\\');
                i += static_cast<size_t>(ss.end() - (s.str + i));
                state = _next(state);
            }
            else if(curr == ',' && next == ' ')
            {
                state = _next(state);
            }
            break;
        }
        default:
            // nothing to do
            break;
        }
    }

    writer.append(s.sub(last));
    if(state == kKeyPending)
        writer.append(": 1");
    writer.append('}');

    return writer.pos;
}